

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultContact.h
# Opt level: O1

void __thiscall
TgBot::InlineQueryResultContact::InlineQueryResultContact(InlineQueryResultContact *this)

{
  (this->super_InlineQueryResult).type._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).type.field_2;
  (this->super_InlineQueryResult).type._M_string_length = 0;
  (this->super_InlineQueryResult).type.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).id._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).id.field_2;
  (this->super_InlineQueryResult).id._M_string_length = 0;
  (this->super_InlineQueryResult).id.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).title._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).title.field_2;
  (this->super_InlineQueryResult).title._M_string_length = 0;
  (this->super_InlineQueryResult).title.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).caption._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).caption.field_2;
  (this->super_InlineQueryResult).caption._M_string_length = 0;
  (this->super_InlineQueryResult).caption.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).replyMarkup.
  super___shared_ptr<TgBot::InlineKeyboardMarkup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_InlineQueryResult).replyMarkup.
  super___shared_ptr<TgBot::InlineKeyboardMarkup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_InlineQueryResult).inputMessageContent.
  super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_InlineQueryResult).inputMessageContent.
  super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultContact_002ab190;
  (this->phoneNumber)._M_dataplus._M_p = (pointer)&(this->phoneNumber).field_2;
  (this->phoneNumber)._M_string_length = 0;
  (this->phoneNumber).field_2._M_local_buf[0] = '\0';
  (this->firstName)._M_dataplus._M_p = (pointer)&(this->firstName).field_2;
  (this->firstName)._M_string_length = 0;
  (this->firstName).field_2._M_local_buf[0] = '\0';
  (this->lastName)._M_dataplus._M_p = (pointer)&(this->lastName).field_2;
  (this->lastName)._M_string_length = 0;
  (this->lastName).field_2._M_local_buf[0] = '\0';
  (this->vcard)._M_dataplus._M_p = (pointer)&(this->vcard).field_2;
  (this->vcard)._M_string_length = 0;
  (this->vcard).field_2._M_local_buf[0] = '\0';
  (this->thumbUrl)._M_dataplus._M_p = (pointer)&(this->thumbUrl).field_2;
  (this->thumbUrl)._M_string_length = 0;
  (this->thumbUrl).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  this->thumbWidth = 0;
  this->thumbHeight = 0;
  return;
}

Assistant:

InlineQueryResultContact() {
        this->type = TYPE;
        this->thumbHeight = 0;
        this->thumbWidth = 0;
    }